

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

bool_t prf_texture_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  uint uVar2;
  int32_t iVar3;
  uint8_t *buffer;
  uint uVar4;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 != prf_texture_info.opcode) {
    prf_error(9,"tried to use texture load method on node of type %d.",(ulong)uVar1);
    uVar2 = 2;
LAB_00109b94:
    bf_rewind(bfile,uVar2);
    return 0;
  }
  uVar1 = bf_get_uint16_be(bfile);
  uVar2 = (uint)uVar1;
  node->length = uVar1;
  buffer = node->data;
  if (buffer == (uint8_t *)0x0) {
    uVar4 = 4;
    if (uVar1 < 5) goto LAB_00109c66;
    pool_id = state->model->mempool_id;
    if (pool_id == 0) {
      buffer = (uint8_t *)malloc((ulong)(uVar2 - 4));
    }
    else {
      buffer = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
    }
    node->data = buffer;
    if (buffer == (uint8_t *)0x0) {
      prf_error(9,"memory allocation problem (returned NULL)");
      uVar2 = 4;
      goto LAB_00109b94;
    }
    uVar2 = (uint)node->length;
  }
  uVar4 = 4;
  if (0xcb < uVar2) {
    bf_read(bfile,buffer,200);
    uVar2 = (uint)node->length;
    if (uVar2 < 0xd0) {
      uVar4 = 0xcc;
    }
    else {
      iVar3 = bf_get_int32_be(bfile);
      *(int32_t *)(buffer + 200) = iVar3;
      uVar2 = (uint)node->length;
      if (uVar2 < 0xd4) {
        uVar4 = 0xd0;
      }
      else {
        iVar3 = bf_get_int32_be(bfile);
        *(int32_t *)(buffer + 0xcc) = iVar3;
        uVar2 = (uint)node->length;
        if (uVar2 < 0xd8) {
          uVar4 = 0xd4;
        }
        else {
          iVar3 = bf_get_int32_be(bfile);
          *(int32_t *)(buffer + 0xd0) = iVar3;
          uVar2 = (uint)node->length;
          uVar4 = 0xd8;
        }
      }
    }
  }
LAB_00109c66:
  if (uVar4 <= uVar2 && uVar2 - uVar4 != 0) {
    bf_read(bfile,node->data + ((ulong)uVar4 - 4),uVar2 - uVar4);
  }
  return 1;
}

Assistant:

static bool_t
prf_texture_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile)
{
    int pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_texture_info.opcode ) {
        prf_error( 9, "tried to use texture load method on node of type %d.",
                   node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }
    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data =
                (uint8_t *) malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data =
                (uint8_t *) pool_malloc( state->model->mempool_id,
                                         node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }
  
    do {
        node_data * data = (node_data *) node->data;
        if ( node->length < (pos + 200) ) break;
        bf_read( bfile, (unsigned char*) data->filename, 200 ); pos += 200;
        if ( node->length < (pos + 4) ) break;
        data->pattern_index = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->x_location = bf_get_int32_be( bfile ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        data->y_location = bf_get_int32_be( bfile ); pos += 4;
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
                        node->length - pos );
    return TRUE;
}